

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O1

long __thiscall
Imath_3_2::Frustum<float>::DepthToZExc(Frustum<float> *this,float depth,long zmin,long zmax)

{
  domain_error *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = this->_nearPlane;
  fVar3 = this->_farPlane;
  fVar2 = fVar3 - fVar1;
  if (this->_orthographic == true) {
    fVar1 = depth + depth + fVar3 + fVar1;
    fVar3 = fVar2;
    if (fVar2 <= -fVar2) {
      fVar3 = -fVar2;
    }
    if (fVar3 < 1.0) {
      fVar5 = fVar1;
      if (fVar1 <= -fVar1) {
        fVar5 = -fVar1;
      }
      if (fVar3 * 3.4028235e+38 < fVar5) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (this_00,
                   "Bad viewing frustum: near and far clipping planes are too close to each other");
LAB_00135fe6:
        __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
    }
    fVar1 = 1.0 - fVar1 / fVar2;
  }
  else {
    fVar4 = (fVar3 + fVar3) * fVar1;
    fVar5 = depth;
    if (depth <= -depth) {
      fVar5 = -depth;
    }
    if (fVar5 < 1.0) {
      fVar6 = fVar4;
      if (fVar4 <= -fVar4) {
        fVar6 = -fVar4;
      }
      if (fVar5 * 3.4028235e+38 < fVar6) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (this_00,"Bad call to DepthToZ function: value of `depth\' is too small");
        goto LAB_00135fe6;
      }
    }
    fVar1 = fVar1 + fVar3 + fVar4 / depth;
    fVar3 = fVar2;
    if (fVar2 <= -fVar2) {
      fVar3 = -fVar2;
    }
    if (fVar3 < 1.0) {
      fVar5 = fVar1;
      if (fVar1 <= -fVar1) {
        fVar5 = -fVar1;
      }
      if (fVar3 * 3.4028235e+38 < fVar5) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (this_00,
                   "Bad viewing frustum: near and far clipping planes are too close to each other");
        goto LAB_00135fe6;
      }
    }
    fVar1 = fVar1 / fVar2 + 1.0;
  }
  return (long)((float)(zmax - zmin) * fVar1 * 0.5) + zmin;
}

Assistant:

IMATH_CONSTEXPR14 long
Frustum<T>::DepthToZExc (T depth, long zmin, long zmax) const
{
    long zdiff        = zmax - zmin;
    T    farMinusNear = _farPlane - _nearPlane;

    if (_orthographic)
    {
        T farPlusNear = T (2) * depth + _farPlane + _nearPlane;

        if (abs (farMinusNear) < T (1) &&
            abs (farPlusNear) >
                std::numeric_limits<T>::max () * abs (farMinusNear))
        {
            throw std::domain_error ("Bad viewing frustum: "
                                     "near and far clipping planes "
                                     "are too close to each other");
        }

        T Zp = -farPlusNear / farMinusNear;
        return long (0.5 * (Zp + 1) * zdiff) + zmin;
    }
    else
    {
        // Perspective

        T farTimesNear = T (2) * _farPlane * _nearPlane;
        if (abs (depth) < T (1) &&
            abs (farTimesNear) > std::numeric_limits<T>::max () * abs (depth))
        {
            throw std::domain_error ("Bad call to DepthToZ function: "
                                     "value of `depth' is too small");
        }

        T farPlusNear = farTimesNear / depth + _farPlane + _nearPlane;
        if (abs (farMinusNear) < T (1) &&
            abs (farPlusNear) >
                std::numeric_limits<T>::max () * abs (farMinusNear))
        {
            throw std::domain_error ("Bad viewing frustum: "
                                     "near and far clipping planes "
                                     "are too close to each other");
        }

        T Zp = farPlusNear / farMinusNear;
        return long (0.5 * (Zp + 1) * zdiff) + zmin;
    }
}